

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftinit.c
# Opt level: O2

void FT_Set_Default_Properties(FT_Library library)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  byte *pbVar7;
  char property_value [129];
  char property_name [129];
  char module_name [129];
  byte local_1d8 [144];
  byte local_148 [144];
  byte local_b8 [136];
  
  pbVar2 = (byte *)getenv("FREETYPE_PROPERTIES");
  if (pbVar2 == (byte *)0x0) {
    return;
  }
  do {
    bVar1 = *pbVar2;
    if ((bVar1 != 9) && (bVar1 != 0x20)) {
      if (bVar1 == 0) {
        return;
      }
      pbVar7 = pbVar2 + 2;
      uVar6 = 0;
      for (pbVar4 = pbVar2; ((uVar6 != 0x80 && (bVar1 = *pbVar4, bVar1 != 0)) && (bVar1 != 0x3a));
          pbVar4 = pbVar4 + 1) {
        local_b8[uVar6] = bVar1;
        uVar6 = uVar6 + 1;
        pbVar7 = pbVar7 + 1;
      }
      local_b8[uVar6 & 0xffffffff] = 0;
      if (*pbVar4 != 0x3a) {
        return;
      }
      if (pbVar4 == pbVar2) {
        return;
      }
      pbVar2 = pbVar7;
      for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
        bVar1 = pbVar4[lVar3 + 1];
        if ((bVar1 == 0) || (bVar1 == 0x3d)) {
          lVar5 = lVar3 + 1;
          goto LAB_001e1066;
        }
        local_148[lVar3] = bVar1;
        pbVar2 = pbVar2 + 1;
      }
      lVar5 = 0x81;
LAB_001e1066:
      local_148[lVar3] = 0;
      if (pbVar4[lVar3 + 1] != 0x3d) {
        return;
      }
      if (lVar5 == 1) {
        return;
      }
      for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
        bVar1 = *pbVar2;
        if (((ulong)bVar1 < 0x21) && ((0x100000201U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          lVar5 = lVar3 + 1;
          goto LAB_001e10ab;
        }
        local_1d8[lVar3] = bVar1;
        pbVar2 = pbVar2 + 1;
      }
      lVar5 = 0x81;
LAB_001e10ab:
      local_1d8[lVar3] = 0;
      if (0x20 < (ulong)*pbVar2) {
        return;
      }
      if ((0x100000201U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0) {
        return;
      }
      if (lVar5 == 1) {
        return;
      }
      ft_property_string_set
                (library,(FT_String *)local_b8,(FT_String *)local_148,(FT_String *)local_1d8);
      if (*pbVar2 == 0) {
        return;
      }
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Set_Default_Properties( FT_Library  library )
  {
    const char*  env;
    const char*  p;
    const char*  q;

    char  module_name[MAX_LENGTH + 1];
    char  property_name[MAX_LENGTH + 1];
    char  property_value[MAX_LENGTH + 1];

    int  i;


    env = ft_getenv( "FREETYPE_PROPERTIES" );
    if ( !env )
      return;

    for ( p = env; *p; p++ )
    {
      /* skip leading whitespace and separators */
      if ( *p == ' ' || *p == '\t' )
        continue;

      /* read module name, followed by `:' */
      q = p;
      for ( i = 0; i < MAX_LENGTH; i++ )
      {
        if ( !*p || *p == ':' )
          break;
        module_name[i] = *p++;
      }
      module_name[i] = '\0';

      if ( !*p || *p != ':' || p == q )
        break;

      /* read property name, followed by `=' */
      q = ++p;
      for ( i = 0; i < MAX_LENGTH; i++ )
      {
        if ( !*p || *p == '=' )
          break;
        property_name[i] = *p++;
      }
      property_name[i] = '\0';

      if ( !*p || *p != '=' || p == q )
        break;

      /* read property value, followed by whitespace (if any) */
      q = ++p;
      for ( i = 0; i < MAX_LENGTH; i++ )
      {
        if ( !*p || *p == ' ' || *p == '\t' )
          break;
        property_value[i] = *p++;
      }
      property_value[i] = '\0';

      if ( !( *p == '\0' || *p == ' ' || *p == '\t' ) || p == q )
        break;

      /* we completely ignore errors */
      ft_property_string_set( library,
                              module_name,
                              property_name,
                              property_value );

      if ( !*p )
        break;
    }
  }